

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

_Bool sftp_action_chmod(void *vctx,char *fname)

{
  fxp_attrs attrs_00;
  unsigned_long uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  sftp_request *psVar5;
  sftp_packet *psVar6;
  char *pcVar7;
  char *local_90;
  sftp_context_chmod *ctx;
  uint newperms;
  uint oldperms;
  _Bool result;
  sftp_request *req;
  sftp_packet *pktin;
  fxp_attrs attrs;
  char *fname_local;
  void *vctx_local;
  
  attrs.mtime = (unsigned_long)fname;
  psVar5 = fxp_stat_send(fname);
  psVar6 = sftp_wait_for_reply(psVar5);
  _Var2 = fxp_stat_recv(psVar6,psVar5,(fxp_attrs *)&pktin);
  uVar1 = attrs.mtime;
  if ((_Var2) && (((ulong)pktin & 4) != 0)) {
    pktin = (sftp_packet *)0x4;
    uVar3 = (uint)attrs.gid & 0xfff;
    attrs.gid = (ulong)*(uint *)((long)vctx + 4) ^ (*vctx ^ 0xffffffff) & attrs.gid;
    uVar4 = (uint)attrs.gid & 0xfff;
    if (uVar3 == uVar4) {
      vctx_local._7_1_ = true;
    }
    else {
      attrs_00.size = attrs.flags;
      attrs_00.flags = 4;
      attrs_00.uid = attrs.size;
      attrs_00.gid = attrs.uid;
      attrs_00.permissions = attrs.gid;
      attrs_00.atime = attrs.permissions;
      attrs_00.mtime = attrs.atime;
      psVar5 = fxp_setstat_send((char *)attrs.mtime,attrs_00);
      psVar6 = sftp_wait_for_reply(psVar5);
      _Var2 = fxp_setstat_recv(psVar6,psVar5);
      uVar1 = attrs.mtime;
      if (_Var2) {
        printf("%s: %04o -> %04o\n",attrs.mtime,(ulong)uVar3,(ulong)uVar4);
        vctx_local._7_1_ = true;
      }
      else {
        pcVar7 = fxp_error();
        printf("set attrs for %s: %s\n",uVar1,pcVar7);
        vctx_local._7_1_ = false;
      }
    }
  }
  else {
    if (_Var2) {
      local_90 = "file permissions not provided";
    }
    else {
      local_90 = fxp_error();
    }
    printf("get attrs for %s: %s\n",uVar1,local_90);
    vctx_local._7_1_ = false;
  }
  return vctx_local._7_1_;
}

Assistant:

static bool sftp_action_chmod(void *vctx, char *fname)
{
    struct fxp_attrs attrs;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    bool result;
    unsigned oldperms, newperms;
    struct sftp_context_chmod *ctx = (struct sftp_context_chmod *)vctx;

    req = fxp_stat_send(fname);
    pktin = sftp_wait_for_reply(req);
    result = fxp_stat_recv(pktin, req, &attrs);

    if (!result || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
        printf("get attrs for %s: %s\n", fname,
               result ? "file permissions not provided" : fxp_error());
        return false;
    }

    attrs.flags = SSH_FILEXFER_ATTR_PERMISSIONS;   /* perms _only_ */
    oldperms = attrs.permissions & 07777;
    attrs.permissions &= ~ctx->attrs_clr;
    attrs.permissions ^= ctx->attrs_xor;
    newperms = attrs.permissions & 07777;

    if (oldperms == newperms)
        return true;                   /* no need to do anything! */

    req = fxp_setstat_send(fname, attrs);
    pktin = sftp_wait_for_reply(req);
    result = fxp_setstat_recv(pktin, req);

    if (!result) {
        printf("set attrs for %s: %s\n", fname, fxp_error());
        return false;
    }

    printf("%s: %04o -> %04o\n", fname, oldperms, newperms);

    return true;
}